

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
* __thiscall
cs_impl::any::
val<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
          (any *this)

{
  bool bVar1;
  undefined8 uVar2;
  string *str;
  flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *pfVar3;
  long *in_RDI;
  string *in_stack_ffffffffffffff38;
  error *in_stack_ffffffffffffff40;
  error *this_00;
  undefined1 local_89 [40];
  allocator local_61;
  string local_60 [35];
  undefined1 local_3d;
  allocator local_29;
  string local_28 [40];
  
  type((any *)in_stack_ffffffffffffff40);
  bVar1 = std::type_info::operator!=
                    ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38);
  if (bVar1) {
    local_3d = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"E0006",&local_29);
    cov::error::error(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_3d = 0;
    __cxa_throw(uVar2,&cov::error::typeinfo,cov::error::~error);
  }
  if (*in_RDI == 0) {
    local_89[0x27] = '\x01';
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"E0005",&local_61);
    cov::error::error(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_89[0x27] = '\0';
    __cxa_throw(uVar2,&cov::error::typeinfo,cov::error::~error);
  }
  if (1 < *(short *)(*in_RDI + 2)) {
    str = (string *)__cxa_allocate_exception(0x28);
    this_00 = (error *)local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_89 + 1),"E000K",(allocator *)this_00);
    cov::error::error(this_00,str);
    __cxa_throw(str,&cov::error::typeinfo,cov::error::~error);
  }
  pfVar3 = holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>
           ::data(*(holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>
                    **)(*in_RDI + 0x10));
  return pfVar3;
}

Assistant:

T &val() const
		{
			if (typeid(T) != this->type())
				throw cov::error("E0006");
			if (this->mDat == nullptr)
				throw cov::error("E0005");
			if (this->mDat->protect_level > 1)
				throw cov::error("E000K");
			return static_cast<holder<T> *>(this->mDat->data)->data();
		}